

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_Io * handleIo_duplicate(PHYSFS_Io *io)

{
  long *plVar1;
  undefined4 uVar2;
  FileHandle *pFVar3;
  PHYSFS_Io *pPVar4;
  PHYSFS_Io *pPVar5;
  FileHandle **ppFVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  plVar1 = (long *)io->opaque;
  pFVar3 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
  if (pFVar3 != (FileHandle *)0x0) {
    pFVar3->bufpos = 0;
    pFVar3->next = (__PHYSFS_FILEHANDLE__ *)0x0;
    pFVar3->bufsize = 0;
    pFVar3->buffill = 0;
    pFVar3->dirHandle = (DirHandle *)0x0;
    pFVar3->buffer = (PHYSFS_uint8 *)0x0;
    pFVar3->io = (PHYSFS_Io *)0x0;
    *(undefined8 *)&pFVar3->forReading = 0;
    pPVar4 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
    if (pPVar4 != (PHYSFS_Io *)0x0) {
      pPVar5 = (PHYSFS_Io *)(**(code **)(*plVar1 + 0x38))();
      pFVar3->io = pPVar5;
      if (pPVar5 != (PHYSFS_Io *)0x0) {
        pFVar3->forReading = (PHYSFS_uint8)plVar1[1];
        pFVar3->dirHandle = (DirHandle *)plVar1[2];
        __PHYSFS_platformGrabMutex(stateLock);
        ppFVar6 = &openReadList;
        if (pFVar3->forReading == '\0') {
          ppFVar6 = &openWriteList;
        }
        pFVar3->next = *ppFVar6;
        *ppFVar6 = pFVar3;
        __PHYSFS_platformReleaseMutex(stateLock);
        pPVar5 = pPVar4;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          uVar2 = *(undefined4 *)&io->field_0x4;
          pPVar5->version = io->version;
          *(undefined4 *)&pPVar5->field_0x4 = uVar2;
          io = (PHYSFS_Io *)((long)io + (ulong)bVar8 * -0x10 + 8);
          pPVar5 = (PHYSFS_Io *)((long)pPVar5 + (ulong)bVar8 * -0x10 + 8);
        }
        pPVar4->opaque = pFVar3;
        return pPVar4;
      }
      goto LAB_0010aaf7;
    }
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
LAB_0010aaf7:
  if (pFVar3 != (FileHandle *)0x0) {
    pPVar4 = pFVar3->io;
    if (pPVar4 != (PHYSFS_Io *)0x0) {
      (*pPVar4->destroy)(pPVar4);
    }
    if (pFVar3->buffer != (PHYSFS_uint8 *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(pFVar3->buffer);
    }
    (*__PHYSFS_AllocatorHooks.Free)(pFVar3);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *handleIo_duplicate(PHYSFS_Io *io)
{
    /*
     * There's no duplicate at the PHYSFS_File level, so we break the
     *  abstraction. We're allowed to: we're physfs.c!
     */
    FileHandle *origfh = (FileHandle *) io->opaque;
    FileHandle *newfh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
    PHYSFS_Io *retval = NULL;

    GOTO_IF(!newfh, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
    memset(newfh, '\0', sizeof (*newfh));

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);

#if 0  /* we don't buffer the duplicate, at least not at the moment. */
    if (origfh->buffer != NULL)
    {
        newfh->buffer = (PHYSFS_uint8 *) allocator.Malloc(origfh->bufsize);
        if (!newfh->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, handleIo_dupe_failed);
        newfh->bufsize = origfh->bufsize;
    } /* if */
#endif

    newfh->io = origfh->io->duplicate(origfh->io);
    GOTO_IF_ERRPASS(!newfh->io, handleIo_dupe_failed);

    newfh->forReading = origfh->forReading;
    newfh->dirHandle = origfh->dirHandle;

    __PHYSFS_platformGrabMutex(stateLock);
    if (newfh->forReading)
    {
        newfh->next = openReadList;
        openReadList = newfh;
    } /* if */
    else
    {
        newfh->next = openWriteList;
        openWriteList = newfh;
    } /* else */
    __PHYSFS_platformReleaseMutex(stateLock);

    memcpy(retval, io, sizeof (PHYSFS_Io));
    retval->opaque = newfh;
    return retval;
    
handleIo_dupe_failed:
    if (newfh)
    {
        if (newfh->io != NULL) newfh->io->destroy(newfh->io);
        if (newfh->buffer != NULL) allocator.Free(newfh->buffer);
        allocator.Free(newfh);
    } /* if */

    return NULL;
}